

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track.c
# Opt level: O0

coord * gettrack(int x,int y)

{
  int iVar1;
  long lVar2;
  coord *local_30;
  coord *local_28;
  coord *tc;
  int ndist;
  int cnt;
  int y_local;
  int x_local;
  
  tc._4_4_ = utcnt;
  local_28 = utrack + utpnt;
  do {
    while( true ) {
      if (tc._4_4_ == 0) {
        return (coord *)0x0;
      }
      if (local_28 == utrack) {
        local_28 = utrack + 0x31;
      }
      else {
        local_28 = local_28 + -1;
      }
      iVar1 = distmin(x,y,(int)local_28->x,(int)local_28->y);
      if (iVar1 < 3) break;
      iVar1 = iVar1 + -2;
      tc._4_4_ = (tc._4_4_ + -1) - iVar1;
      if (tc._4_4_ < 1) {
        return (coord *)0x0;
      }
      if (local_28 < utrack + iVar1) {
        lVar2 = (long)(0x32 - iVar1) * 2;
      }
      else {
        lVar2 = (long)iVar1 * -2;
      }
      local_28 = (coord *)(&local_28->x + lVar2);
    }
    tc._4_4_ = tc._4_4_ + -1;
  } while (1 < iVar1);
  if (iVar1 == 0) {
    local_30 = (coord *)0x0;
  }
  else {
    local_30 = local_28;
  }
  return local_30;
}

Assistant:

coord *gettrack(int x, int y)
{
    int cnt, ndist;
    coord *tc;
    cnt = utcnt;
    for (tc = &utrack[utpnt]; cnt--; ){
	if (tc == utrack) tc = &utrack[UTSZ-1];
	else tc--;
	ndist = distmin(x,y,tc->x,tc->y);

	/* if far away, skip track entries til we're closer */
	if (ndist > 2) {
	    ndist -= 2; /* be careful due to extra decrement at top of loop */
	    cnt -= ndist;
	    if (cnt <= 0)
		return NULL; /* too far away, no matches possible */
	    if (tc < &utrack[ndist])
		tc += (UTSZ-ndist);
	    else
		tc -= ndist;
	} else if (ndist <= 1)
	    return ndist ? tc : 0;
    }
    return NULL;
}